

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper.c
# Opt level: O2

_Bool pmu_counter_enabled(CPUARMState_conflict *env,uint8_t counter)

{
  ulong uVar1;
  bool bVar2;
  _Bool _Var3;
  _Bool _Var4;
  int iVar5;
  uint64_t *puVar6;
  uint uVar7;
  byte bVar8;
  ulong uVar9;
  bool bVar10;
  ulong uVar11;
  uint uVar12;
  bool bVar13;
  
  _Var3 = arm_is_secure(env);
  iVar5 = arm_current_el(env);
  uVar1 = env->features;
  if ((uVar1 >> 0x23 & 1) != 0) {
    uVar9 = (env->cp15).mdcr_el2;
    uVar11 = (ulong)counter;
    if (((uVar1 >> 0x20 & 1) == 0) || (counter == '\x1f' || counter < ((byte)uVar9 & 0x1f))) {
      if (((env->cp15).c9_pmcr & 1) == 0) goto LAB_005ad4b2;
LAB_005ad49a:
      bVar13 = ((env->cp15).c9_pmcnten >> (uVar11 & 0x3f) & 1) != 0;
    }
    else {
      if ((char)(byte)uVar9 < '\0') goto LAB_005ad49a;
LAB_005ad4b2:
      bVar13 = false;
    }
    if (_Var3) {
      if ((uVar1 & 0x200000000) == 0) {
LAB_005ad522:
        bVar8 = 0;
        if (counter != '\x1f') goto LAB_005ad534;
      }
      else {
        uVar9 = (env->cp15).mdcr_el3;
LAB_005ad4de:
        bVar8 = (byte)(uVar9 >> 0x11);
        if (counter == '\x1f' && (~bVar8 & 1) == 0) {
          bVar8 = (byte)(env->cp15).c9_pmcr >> 5;
        }
        else if (counter != '\x1f') {
          bVar2 = false;
          puVar6 = (env->cp15).c14_pmevtyper + uVar11;
          goto LAB_005ad557;
        }
      }
      puVar6 = &(env->cp15).pmccfiltr_el0;
      bVar2 = true;
    }
    else {
      if (iVar5 != 2) goto LAB_005ad522;
      if ((counter == '\x1f') || ((uint)counter < ((uint)uVar9 & 7))) goto LAB_005ad4de;
LAB_005ad534:
      bVar8 = 0;
      puVar6 = (env->cp15).c14_pmevtyper + uVar11;
      bVar2 = false;
    }
LAB_005ad557:
    uVar9 = *puVar6;
    uVar12 = (uint)uVar9;
    _Var4 = arm_el_is_aa64(env,1);
    uVar7 = 0;
    if ((_Var4) && (uVar7 = 0, (env->features & 0x200000000) != 0)) {
      uVar7 = (uint)(uVar9 >> 0x1a) & 1;
    }
    if (iVar5 == 2) {
      bVar10 = (uVar1 >> 0x20 & 1) == 0 || (uVar12 >> 0x1b & 1) == 0;
    }
    else if (iVar5 == 1) {
      bVar10 = (bool)(~_Var3 & (uVar1 & 0x200000000) != 0 & (byte)(uVar9 >> 0x1d) & 1 ^
                     (int)uVar12 < 0);
    }
    else if (iVar5 == 0) {
      bVar10 = (uVar9 & 0x40000000) != 0;
      if (!_Var3) {
        bVar10 = (uVar12 & 0x40000000) >> 0x1e !=
                 (uint)((uVar1 & 0x200000000) != 0 & (byte)(uVar9 >> 0x1c) & 1);
      }
    }
    else {
      bVar10 = uVar7 != ((uint)(uVar9 >> 0x1f) & 1);
    }
    if (bVar2) {
      if (bVar13) {
LAB_005ad662:
        bVar8 = (bVar8 | bVar10) ^ 1;
        goto LAB_005ad454;
      }
    }
    else if (((ushort)uVar9 < 0x3d) &&
            ((bool)(bVar13 & supported_event_map[uVar12 & 0x3f] != 0xffff))) goto LAB_005ad662;
  }
  bVar8 = 0;
LAB_005ad454:
  return (_Bool)(bVar8 & 1);
}

Assistant:

static bool pmu_counter_enabled(CPUARMState *env, uint8_t counter)
{
    uint64_t filter;
    bool e, p, u, nsk, nsu, nsh, m;
    bool enabled, prohibited, filtered;
    bool secure = arm_is_secure(env);
    int el = arm_current_el(env);
    uint8_t hpmn = env->cp15.mdcr_el2 & MDCR_HPMN;

    if (!arm_feature(env, ARM_FEATURE_PMU)) {
        return false;
    }

    if (!arm_feature(env, ARM_FEATURE_EL2) ||
            (counter < hpmn || counter == 31)) {
        e = env->cp15.c9_pmcr & PMCRE;
    } else {
        e = env->cp15.mdcr_el2 & MDCR_HPME;
    }
    enabled = e && (env->cp15.c9_pmcnten & (1ULL << counter));

    if (!secure) {
        if (el == 2 && (counter < (hpmn & 0x7) || counter == 31)) {
            prohibited = env->cp15.mdcr_el2 & MDCR_HPMD;
        } else {
            prohibited = false;
        }
    } else {
        prohibited = arm_feature(env, ARM_FEATURE_EL3) &&
           (env->cp15.mdcr_el3 & MDCR_SPME);
    }

    if (prohibited && counter == 31) {
        prohibited = env->cp15.c9_pmcr & PMCRDP;
    }

    if (counter == 31) {
        filter = env->cp15.pmccfiltr_el0;
    } else {
        filter = env->cp15.c14_pmevtyper[counter];
    }

    p   = filter & PMXEVTYPER_P;
    u   = filter & PMXEVTYPER_U;
    nsk = arm_feature(env, ARM_FEATURE_EL3) && (filter & PMXEVTYPER_NSK);
    nsu = arm_feature(env, ARM_FEATURE_EL3) && (filter & PMXEVTYPER_NSU);
    nsh = arm_feature(env, ARM_FEATURE_EL2) && (filter & PMXEVTYPER_NSH);
    m   = arm_el_is_aa64(env, 1) &&
              arm_feature(env, ARM_FEATURE_EL3) && (filter & PMXEVTYPER_M);

    if (el == 0) {
        filtered = secure ? u : u != nsu;
    } else if (el == 1) {
        filtered = secure ? p : p != nsk;
    } else if (el == 2) {
        filtered = !nsh;
    } else { /* EL3 */
        filtered = m != p;
    }

    if (counter != 31) {
        /*
         * If not checking PMCCNTR, ensure the counter is setup to an event we
         * support
         */
        uint16_t event = filter & PMXEVTYPER_EVTCOUNT;
        if (!event_supported(event)) {
            return false;
        }
    }

    return enabled && !prohibited && !filtered;
}